

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O0

void __thiscall RK4::Step(RK4 *this,double t,Mat *y,double h,Mat *u)

{
  Derivs2 p_Var1;
  double dVar2;
  double *in_RCX;
  double dVar3;
  Mat MVar4;
  Mat MVar5;
  Mat MVar6;
  Mat MVar7;
  Mat MVar8;
  Mat MVar9;
  Mat MVar10;
  Mat MVar11;
  Mat local_208;
  Mat local_1f8;
  Mat local_1e8;
  Mat local_1d8;
  Mat local_1c8;
  Mat local_1b8;
  Mat local_1a8;
  Mat local_198;
  Mat local_188;
  Mat local_178;
  Mat local_168;
  Mat local_158;
  Mat local_148;
  Mat local_138;
  Mat local_128;
  Mat local_118;
  Mat local_108;
  Mat local_f8;
  Mat local_e8;
  Mat local_d8;
  Mat local_c8;
  Mat local_b8;
  Mat local_a8 [2];
  Mat local_88;
  Mat local_78;
  Mat local_68;
  Mat local_58;
  double local_48;
  double th;
  double h6;
  double hh;
  Mat *u_local;
  double h_local;
  Mat *y_local;
  double t_local;
  RK4 *this_local;
  
  h6 = h * 0.5;
  th = h / 6.0;
  local_48 = t + h6;
  p_Var1 = this->f_;
  hh = (double)u;
  u_local = (Mat *)h;
  h_local = (double)y;
  y_local = (Mat *)t;
  t_local = (double)this;
  Mat::Mat(&local_78,y);
  Mat::Mat(&local_88,u);
  MVar4.v_ = (double *)&local_78;
  MVar4._0_8_ = &local_68;
  MVar8.v_ = in_RCX;
  MVar8._0_8_ = &local_88;
  (*p_Var1)(t,MVar4,MVar8);
  Mat::operator=(&local_58,&this->k_1_);
  Mat::~Mat(&local_58);
  Mat::~Mat(&local_68);
  Mat::~Mat(&local_88);
  Mat::~Mat(&local_78);
  dVar2 = h_local;
  p_Var1 = this->f_;
  dVar3 = (double)y_local + h6;
  operator*(&local_d8,h6);
  operator+(&local_c8,(Mat *)dVar2);
  Mat::Mat(&local_e8,u);
  MVar5.v_ = (double *)&local_c8;
  MVar5._0_8_ = &local_b8;
  MVar9.v_ = in_RCX;
  MVar9._0_8_ = &local_e8;
  (*p_Var1)(dVar3,MVar5,MVar9);
  Mat::operator=(local_a8,&this->k_2_);
  Mat::~Mat(local_a8);
  Mat::~Mat(&local_b8);
  Mat::~Mat(&local_e8);
  Mat::~Mat(&local_c8);
  Mat::~Mat(&local_d8);
  dVar2 = h_local;
  p_Var1 = this->f_;
  dVar3 = (double)y_local + (double)u_local;
  operator*(&local_128,h6);
  operator+(&local_118,(Mat *)dVar2);
  Mat::Mat(&local_138,u);
  MVar6.v_ = (double *)&local_118;
  MVar6._0_8_ = &local_108;
  MVar10.v_ = in_RCX;
  MVar10._0_8_ = &local_138;
  (*p_Var1)(dVar3,MVar6,MVar10);
  Mat::operator=(&local_f8,&this->k_3_);
  Mat::~Mat(&local_f8);
  Mat::~Mat(&local_108);
  Mat::~Mat(&local_138);
  Mat::~Mat(&local_118);
  Mat::~Mat(&local_128);
  dVar2 = h_local;
  p_Var1 = this->f_;
  dVar3 = (double)y_local + (double)u_local;
  operator*(&local_178,(double)u_local);
  operator+(&local_168,(Mat *)dVar2);
  Mat::Mat(&local_188,u);
  MVar7.v_ = (double *)&local_168;
  MVar7._0_8_ = &local_158;
  MVar11.v_ = in_RCX;
  MVar11._0_8_ = &local_188;
  (*p_Var1)(dVar3,MVar7,MVar11);
  Mat::operator=(&local_148,&this->k_4_);
  Mat::~Mat(&local_148);
  Mat::~Mat(&local_158);
  Mat::~Mat(&local_188);
  Mat::~Mat(&local_168);
  Mat::~Mat(&local_178);
  dVar3 = h_local;
  dVar2 = th;
  operator*(&local_1f8,2.0);
  operator+(&local_1e8,&this->k_1_);
  operator*(&local_208,2.0);
  operator+(&local_1d8,&local_1e8);
  operator+(&local_1c8,&local_1d8);
  operator*(dVar2,&local_1b8);
  operator+(&local_1a8,(Mat *)dVar3);
  Mat::operator=(&local_198,(Mat *)h_local);
  Mat::~Mat(&local_198);
  Mat::~Mat(&local_1a8);
  Mat::~Mat(&local_1b8);
  Mat::~Mat(&local_1c8);
  Mat::~Mat(&local_1d8);
  Mat::~Mat(&local_208);
  Mat::~Mat(&local_1e8);
  Mat::~Mat(&local_1f8);
  this->n_fevals_ = this->n_fevals_ + 4;
  this->n_steps_ = this->n_steps_ + 1;
  return;
}

Assistant:

void RK4::Step(double t, Mat& y, double h, Mat u) {		
	// Elementary RK4 step
	double hh = h*0.5;
	double h6 = h/6.0;
	double th = t+hh;
	k_1_ = f_(t, y, u);
	k_2_ = f_(t+hh, y+k_1_*hh, u);
	k_3_ = f_(t+h, y+k_2_*hh, u);  
	k_4_ = f_(t+h, y+k_3_*h, u);
	y = y + h6*(k_1_ + k_2_*2.0 + k_3_*2.0 + k_4_);
	n_fevals_ += 4;
	n_steps_ += 1;  
	t = t + h; // Update independent variable
}